

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3OpenTokenizer
              (sqlite3_tokenizer *pTokenizer,int iLangid,char *z,int n,
              sqlite3_tokenizer_cursor **ppCsr)

{
  int *piVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  int rc;
  sqlite3_tokenizer_module *pModule;
  sqlite3_tokenizer_cursor *pCsr;
  int local_44;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = (int *)*in_RDI;
  local_10 = (undefined8 *)0x0;
  local_44 = (**(code **)(piVar1 + 6))(in_RDI,in_RDX,in_ECX,&local_10);
  if (((local_44 == 0) && (*local_10 = in_RDI, 0 < *piVar1)) &&
     (local_44 = (**(code **)(piVar1 + 0xc))(local_10,in_ESI), local_44 != 0)) {
    (**(code **)(piVar1 + 8))(local_10);
    local_10 = (undefined8 *)0x0;
  }
  *in_R8 = local_10;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3OpenTokenizer(
  sqlite3_tokenizer *pTokenizer,
  int iLangid,
  const char *z,
  int n,
  sqlite3_tokenizer_cursor **ppCsr
){
  sqlite3_tokenizer_module const *pModule = pTokenizer->pModule;
  sqlite3_tokenizer_cursor *pCsr = 0;
  int rc;

  rc = pModule->xOpen(pTokenizer, z, n, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( rc==SQLITE_OK ){
    pCsr->pTokenizer = pTokenizer;
    if( pModule->iVersion>=1 ){
      rc = pModule->xLanguageid(pCsr, iLangid);
      if( rc!=SQLITE_OK ){
        pModule->xClose(pCsr);
        pCsr = 0;
      }
    }
  }
  *ppCsr = pCsr;
  return rc;
}